

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O3

int run_test_fs_event_ref(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  undefined8 uVar3;
  int64_t eval_b;
  int64_t eval_a;
  uv_fs_event_t h;
  undefined1 auStack_3c0 [216];
  code *pcStack_2e8;
  long lStack_2d8;
  long lStack_2d0;
  undefined1 auStack_2c8 [216];
  code *pcStack_1f0;
  long lStack_1e0;
  long lStack_1d8;
  undefined1 auStack_1d0 [216];
  code *pcStack_f8;
  long lStack_e8;
  long lStack_e0;
  undefined1 auStack_d8 [72];
  code *pcStack_90;
  long local_80;
  long local_78;
  undefined1 local_70 [104];
  
  pcStack_90 = (code *)0x1b9032;
  uVar2 = uv_default_loop();
  pcStack_90 = (code *)0x1b9042;
  uv_fs_event_init(uVar2,local_70);
  pcStack_90 = (code *)0x1b905a;
  uv_fs_event_start(local_70,fail_cb,".",0);
  pcStack_90 = (code *)0x1b9062;
  uv_unref(local_70);
  pcStack_90 = (code *)0x1b9067;
  uVar2 = uv_default_loop();
  pcStack_90 = (code *)0x1b9071;
  uv_run(uVar2,0);
  pcStack_90 = (code *)0x1b9079;
  do_close(local_70);
  pcStack_90 = (code *)0x1b907e;
  uVar2 = uv_default_loop();
  pcStack_90 = (code *)0x1b9092;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_90 = (code *)0x1b909c;
  uv_run(uVar2,0);
  local_78 = 0;
  pcStack_90 = (code *)0x1b90aa;
  uVar3 = uv_default_loop();
  pcStack_90 = (code *)0x1b90b2;
  iVar1 = uv_loop_close(uVar3);
  local_80 = (long)iVar1;
  if (local_78 == local_80) {
    pcStack_90 = (code *)0x1b90ca;
    uv_library_shutdown();
    return 0;
  }
  pcStack_90 = run_test_fs_poll_ref;
  run_test_fs_event_ref_cold_1();
  pcStack_f8 = (code *)0x1b90ee;
  pcStack_90 = (code *)uVar2;
  uVar2 = uv_default_loop();
  pcStack_f8 = (code *)0x1b90fe;
  uv_fs_poll_init(uVar2,auStack_d8);
  pcStack_f8 = (code *)0x1b9114;
  uv_fs_poll_start(auStack_d8,0,".",999);
  pcStack_f8 = (code *)0x1b911c;
  uv_unref(auStack_d8);
  pcStack_f8 = (code *)0x1b9121;
  uVar2 = uv_default_loop();
  pcStack_f8 = (code *)0x1b912b;
  uv_run(uVar2,0);
  pcStack_f8 = (code *)0x1b9133;
  do_close(auStack_d8);
  pcStack_f8 = (code *)0x1b9138;
  uVar2 = uv_default_loop();
  pcStack_f8 = (code *)0x1b914c;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_f8 = (code *)0x1b9156;
  uv_run(uVar2,0);
  lStack_e0 = 0;
  pcStack_f8 = (code *)0x1b9164;
  uVar3 = uv_default_loop();
  pcStack_f8 = (code *)0x1b916c;
  iVar1 = uv_loop_close(uVar3);
  lStack_e8 = (long)iVar1;
  if (lStack_e0 == lStack_e8) {
    pcStack_f8 = (code *)0x1b9184;
    uv_library_shutdown();
    return 0;
  }
  pcStack_f8 = run_test_tcp_ref;
  run_test_fs_poll_ref_cold_1();
  pcStack_1f0 = (code *)0x1b91a8;
  pcStack_f8 = (code *)uVar2;
  uVar2 = uv_default_loop();
  pcStack_1f0 = (code *)0x1b91b8;
  uv_tcp_init(uVar2,auStack_1d0);
  pcStack_1f0 = (code *)0x1b91c0;
  uv_unref(auStack_1d0);
  pcStack_1f0 = (code *)0x1b91c5;
  uVar2 = uv_default_loop();
  pcStack_1f0 = (code *)0x1b91cf;
  uv_run(uVar2,0);
  pcStack_1f0 = (code *)0x1b91d7;
  do_close(auStack_1d0);
  pcStack_1f0 = (code *)0x1b91dc;
  uVar2 = uv_default_loop();
  pcStack_1f0 = (code *)0x1b91f0;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_1f0 = (code *)0x1b91fa;
  uv_run(uVar2,0);
  lStack_1d8 = 0;
  pcStack_1f0 = (code *)0x1b9208;
  uVar3 = uv_default_loop();
  pcStack_1f0 = (code *)0x1b9210;
  iVar1 = uv_loop_close(uVar3);
  lStack_1e0 = (long)iVar1;
  if (lStack_1d8 == lStack_1e0) {
    pcStack_1f0 = (code *)0x1b9228;
    uv_library_shutdown();
    return 0;
  }
  pcStack_1f0 = run_test_tcp_ref2;
  run_test_tcp_ref_cold_1();
  pcStack_2e8 = (code *)0x1b924f;
  pcStack_1f0 = (code *)uVar2;
  uVar2 = uv_default_loop();
  pcStack_2e8 = (code *)0x1b925f;
  uv_tcp_init(uVar2,auStack_2c8);
  pcStack_2e8 = (code *)0x1b9273;
  uv_listen(auStack_2c8,0x80,fail_cb);
  pcStack_2e8 = (code *)0x1b927b;
  uv_unref(auStack_2c8);
  pcStack_2e8 = (code *)0x1b9280;
  uVar2 = uv_default_loop();
  pcStack_2e8 = (code *)0x1b928a;
  uv_run(uVar2,0);
  pcStack_2e8 = (code *)0x1b9292;
  do_close(auStack_2c8);
  pcStack_2e8 = (code *)0x1b9297;
  uVar2 = uv_default_loop();
  pcStack_2e8 = (code *)0x1b92ab;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_2e8 = (code *)0x1b92b5;
  uv_run(uVar2,0);
  lStack_2d0 = 0;
  pcStack_2e8 = (code *)0x1b92c3;
  uVar3 = uv_default_loop();
  pcStack_2e8 = (code *)0x1b92cb;
  iVar1 = uv_loop_close(uVar3);
  lStack_2d8 = (long)iVar1;
  if (lStack_2d0 == lStack_2d8) {
    pcStack_2e8 = (code *)0x1b92e3;
    uv_library_shutdown();
    return 0;
  }
  pcStack_2e8 = run_test_tcp_ref2b;
  run_test_tcp_ref2_cold_1();
  pcStack_2e8 = (code *)uVar2;
  uVar2 = uv_default_loop();
  uv_tcp_init(uVar2,auStack_3c0);
  uv_listen(auStack_3c0,0x80,fail_cb);
  uv_unref(auStack_3c0);
  uv_close(auStack_3c0,close_cb);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  if (close_cb_called == 1) {
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_tcp_ref2b_cold_1();
  }
  run_test_tcp_ref2b_cold_2();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_event_ref) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  uv_fs_event_t h;
  uv_fs_event_init(uv_default_loop(), &h);
  uv_fs_event_start(&h, (uv_fs_event_cb)fail_cb, ".", 0);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}